

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O3

WebPChunk * ChunkRelease(WebPChunk *chunk)

{
  WebPChunk *pWVar1;
  
  if (chunk != (WebPChunk *)0x0) {
    if (chunk->owner_ != 0) {
      WebPFree((chunk->data_).bytes);
    }
    pWVar1 = chunk->next_;
    chunk->tag_ = 0;
    chunk->owner_ = 0;
    (chunk->data_).bytes = (uint8_t *)0x0;
    (chunk->data_).size = 0;
    chunk->next_ = (WebPChunk *)0x0;
    return pWVar1;
  }
  return (WebPChunk *)0x0;
}

Assistant:

WebPChunk* ChunkRelease(WebPChunk* const chunk) {
  WebPChunk* next;
  if (chunk == NULL) return NULL;
  if (chunk->owner_) {
    WebPDataClear(&chunk->data_);
  }
  next = chunk->next_;
  ChunkInit(chunk);
  return next;
}